

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O2

int tag_label(mdl_t *mdl,FILE *fin,FILE *fout)

{
  long *plVar1;
  undefined8 uVar2;
  _Bool _Var3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  rdr_t *prVar7;
  raw_t rVar8;
  opt_t *poVar9;
  long lVar10;
  FILE *__stream;
  qrk_t *pqVar11;
  uint32_t y;
  int iVar12;
  ulong uVar13;
  raw_t *prVar14;
  seq_t *psVar15;
  uint32_t **ppuVar16;
  double **psc;
  double *pdVar17;
  char *pcVar18;
  ulong uVar19;
  byte bVar20;
  long lVar21;
  uint32_t y_1;
  uint32_t N;
  ulong uVar22;
  uint64_t id;
  long lVar23;
  size_t sVar24;
  size_t size;
  long lVar25;
  uint32_t t;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 uStack_100;
  FILE *local_f8;
  ulong local_f0;
  long local_e8;
  size_t local_e0;
  uint32_t **local_d8;
  qrk_t *local_d0;
  ulong local_c8;
  raw_t *local_c0;
  double *local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  undefined1 local_78 [24];
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  seq_t *local_40;
  ulong local_38;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  local_d0 = mdl->reader->lbl;
  uVar19 = (ulong)mdl->nlbl;
  uVar22 = (ulong)mdl->opt->nbest;
  lVar10 = -(uVar19 * 0x18 + 0xf & 0xfffffffffffffff0);
  lVar21 = (long)&local_f8 + lVar10;
  lVar25 = uVar19 * 0x10 + lVar21;
  lVar23 = lVar21 + uVar19 * 8;
  for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
    *(undefined8 *)(lVar25 + uVar13 * 8) = 0;
    *(undefined8 *)(lVar23 + uVar13 * 8) = 0;
    *(undefined8 *)(lVar21 + uVar13 * 8) = 0;
  }
  local_e8 = uVar22 * 4;
  local_e0 = uVar22 * 8;
  local_50 = 0;
  local_38 = 0;
  local_58 = 0;
  local_48 = 0;
  local_f8 = (FILE *)fin;
  local_f0 = uVar19;
  local_c8 = uVar22;
  local_b0 = lVar21;
  local_a8 = lVar25;
  local_a0 = lVar23;
  while( true ) {
    __stream = local_f8;
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x1073d2;
    iVar12 = feof(__stream);
    if (iVar12 != 0) break;
    prVar7 = mdl->reader;
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x1073e6;
    prVar14 = rdr_readraw(prVar7,(FILE *)__stream);
    if (prVar14 == (raw_t *)0x0) break;
    prVar7 = mdl->reader;
    _Var3 = mdl->opt->force;
    _Var4 = mdl->opt->check;
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107410;
    psVar15 = rdr_raw2seq(prVar7,prVar14,(_Bool)(_Var3 | _Var4));
    if (psVar15 == (seq_t *)0x0) {
      *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107997;
      rdr_freeraw(prVar14);
      return 0;
    }
    dVar26 = (double)(ulong)psVar15->len;
    sVar24 = local_e8 * (long)dVar26;
    local_c0 = prVar14;
    local_40 = psVar15;
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107437;
    ppuVar16 = (uint32_t **)xmalloc(sVar24);
    sVar24 = local_e0;
    size = local_e0 * (long)dVar26;
    local_88 = dVar26;
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107451;
    psc = (double **)xmalloc(size);
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x10745c;
    pdVar17 = (double *)xmalloc(sVar24);
    psVar15 = local_40;
    uVar13 = local_c8;
    N = (uint32_t)local_c8;
    local_b8 = pdVar17;
    if (N == 1) {
      *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107484;
      tag_viterbi(mdl,psVar15,(uint32_t *)ppuVar16,pdVar17,(double *)psc);
    }
    else {
      *(undefined8 *)((long)&uStack_100 + lVar10) = 0x10749a;
      tag_nbviterbi(mdl,psVar15,N,ppuVar16,pdVar17,psc);
    }
    local_d8 = ppuVar16;
    local_78._0_8_ = psc;
    uVar19 = 0;
    while (ppuVar16 = local_d8, uVar19 != uVar13) {
      local_60 = uVar19;
      if (mdl->opt->outsc == true) {
        dVar26 = local_b8[uVar19];
        *(undefined8 *)((long)&uStack_100 + lVar10) = 0x1074e1;
        fprintf((FILE *)fout,"# %d %f\n",dVar26,uVar19);
      }
      uVar19 = local_60;
      for (dVar26 = 0.0; local_88 != dVar26; dVar26 = (double)((long)dVar26 + 1)) {
        if (mdl->opt->label == false) {
          rVar8 = local_c0[(long)dVar26 + 1];
          uVar19 = uVar19 & 0xffffffff;
          *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107520;
          fprintf((FILE *)fout,"%s\t",rVar8);
        }
        pqVar11 = local_d0;
        local_98 = (double)CONCAT44(local_98._4_4_,(int)uVar19);
        uVar5 = *(uint *)((long)local_d8 + (uVar19 & 0xffffffff) * 4);
        *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107542;
        pcVar18 = qrk_id2str(pqVar11,(ulong)uVar5);
        *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107550;
        fputs(pcVar18,(FILE *)fout);
        if (mdl->opt->outsc == true) {
          *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107570;
          fprintf((FILE *)fout,"\t%s",pcVar18);
          uVar2 = *(undefined8 *)(local_78._0_8_ + (uVar19 & 0xffffffff) * 8);
          *(undefined8 *)((long)&uStack_100 + lVar10) = 0x10758b;
          fprintf((FILE *)fout,"/%f",uVar2);
        }
        *(undefined8 *)((long)&uStack_100 + lVar10) = 10;
        uVar2 = *(undefined8 *)((long)&uStack_100 + lVar10);
        *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107596;
        fputc((int)uVar2,(FILE *)fout);
        uVar19 = (ulong)(uint)(local_98._0_4_ + (int)local_c8);
        uVar13 = local_c8;
        psc = (double **)local_78._0_8_;
      }
      *(undefined8 *)((long)&uStack_100 + lVar10) = 10;
      uVar2 = *(undefined8 *)((long)&uStack_100 + lVar10);
      *(undefined8 *)((long)&uStack_100 + lVar10) = 0x1075bf;
      fputc((int)uVar2,(FILE *)fout);
      uVar19 = local_60 + 1;
    }
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x1075da;
    fflush((FILE *)fout);
    pdVar17 = local_b8;
    if (mdl->opt->check == true) {
      uVar19 = 0;
      bVar20 = 0;
      for (lVar23 = 0; (long)local_88 << 5 != lVar23; lVar23 = lVar23 + 0x20) {
        uVar5 = *(uint *)((long)&local_40[1].len + lVar23);
        if ((ulong)uVar5 != 0xffffffff) {
          plVar1 = (long *)(local_b0 + (ulong)uVar5 * 8);
          *plVar1 = *plVar1 + 1;
          uVar6 = *(uint *)((long)ppuVar16 + uVar19 * 4);
          plVar1 = (long *)(local_a0 + (ulong)uVar6 * 8);
          *plVar1 = *plVar1 + 1;
          if (uVar5 == uVar6) {
            plVar1 = (long *)(local_a8 + (ulong)uVar6 * 8);
            *plVar1 = *plVar1 + 1;
          }
          else {
            local_58 = local_58 + 1;
            bVar20 = 1;
          }
        }
        uVar19 = (ulong)(uint)((int)uVar19 + (int)uVar13);
      }
      local_48 = local_48 + (long)local_88;
      local_50 = local_50 + (ulong)bVar20;
    }
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107668;
    free(pdVar17);
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107670;
    free(psc);
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107678;
    free(ppuVar16);
    psVar15 = local_40;
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107681;
    rdr_freeseq(psVar15);
    prVar14 = local_c0;
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x10768d;
    rdr_freeraw(prVar14);
    uVar13 = local_38 + 1;
    local_38 = uVar13;
    if (uVar13 % 1000 == 0) {
      *(undefined8 *)((long)&uStack_100 + lVar10) = 0x1076bd;
      info("%10lu sequences labeled",uVar13);
      if (mdl->opt->check == true) {
        auVar33._8_4_ = (int)((ulong)local_58 >> 0x20);
        auVar33._0_8_ = local_58;
        auVar33._12_4_ = 0x45300000;
        uVar31 = (undefined4)local_58;
        auVar34._8_4_ = (int)((ulong)local_48 >> 0x20);
        auVar34._0_8_ = local_48;
        auVar34._12_4_ = 0x45300000;
        uVar32 = (undefined4)local_48;
        auVar37._8_4_ = (int)((ulong)local_50 >> 0x20);
        auVar37._0_8_ = local_50;
        auVar37._12_4_ = 0x45300000;
        uVar35 = (undefined4)local_50;
        auVar38._8_4_ = (int)(local_38 >> 0x20);
        auVar38._0_8_ = local_38;
        auVar38._12_4_ = 0x45300000;
        uVar36 = (undefined4)local_38;
        *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107763;
        info("\t%5.2f%%/%5.2f%%",
             (((auVar33._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar31) - 4503599627370496.0)) /
             ((auVar34._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar32) - 4503599627370496.0))) * 100.0,
             (((auVar37._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar35) - 4503599627370496.0)) /
             ((auVar38._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar36) - 4503599627370496.0))) * 100.0);
      }
      *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107771;
      info("\n");
    }
  }
  poVar9 = mdl->opt;
  *(undefined8 *)((long)&uStack_100 + lVar10) = 1;
  iVar12 = (int)*(undefined8 *)((long)&uStack_100 + lVar10);
  if (poVar9->check == true) {
    auVar27._8_4_ = (int)((ulong)local_58 >> 0x20);
    auVar27._0_8_ = local_58;
    auVar27._12_4_ = 0x45300000;
    dStack_90 = auVar27._8_8_ - 1.9342813113834067e+25;
    auVar28._8_4_ = (int)((ulong)local_48 >> 0x20);
    auVar28._0_8_ = local_48;
    auVar28._12_4_ = 0x45300000;
    local_98 = ((dStack_90 + ((double)CONCAT44(0x43300000,(int)local_58) - 4503599627370496.0)) /
               ((auVar28._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0))) * 100.0;
    auVar29._8_4_ = (int)((ulong)local_50 >> 0x20);
    auVar29._0_8_ = local_50;
    auVar29._12_4_ = 0x45300000;
    local_78._8_8_ = auVar29._8_8_ - 1.9342813113834067e+25;
    auVar30._8_4_ = (int)(local_38 >> 0x20);
    auVar30._0_8_ = local_38;
    auVar30._12_4_ = 0x45300000;
    local_78._0_8_ =
         (((double)local_78._8_8_ +
          ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0)) /
         ((auVar30._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0))) * 100.0;
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107831;
    info("    Nb sequences  : %lu\n");
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107846;
    info("    Token error   : %5.2f%%\n");
    uVar2 = local_78._0_8_;
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107859;
    info("    Sequence error: %5.2f%%\n",uVar2);
    *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107867;
    info("* Per label statistics\n");
    for (id = 0; pqVar11 = local_d0, local_f0 != id; id = id + 1) {
      *(undefined8 *)((long)&uStack_100 + lVar10) = 0x1078a1;
      pcVar18 = qrk_id2str(pqVar11,id);
      uVar2 = *(undefined8 *)(local_a8 + id * 8);
      auVar40._0_8_ = (double)CONCAT44(0x43300000,(int)uVar2);
      auVar40._8_4_ = (int)((ulong)uVar2 >> 0x20);
      auVar40._12_4_ = 0x45300000;
      dVar26 = auVar40._8_8_ - 1.9342813113834067e+25;
      uVar13 = *(ulong *)(local_a0 + id * 8);
      uVar19 = *(ulong *)(local_b0 + id * 8);
      auVar39._0_8_ =
           ((double)(uVar19 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(uVar19 & 0xffffffff | 0x4330000000000000);
      auVar39._8_8_ =
           ((double)(uVar13 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(uVar13 & 0xffffffff | 0x4330000000000000);
      auVar41._0_8_ = (auVar40._0_8_ - 4503599627370496.0) + dVar26;
      auVar41._8_8_ = (auVar40._0_8_ - 4503599627370496.0) + dVar26;
      local_78._0_16_ = divpd(auVar41,auVar39);
      dStack_90 = local_78._8_8_;
      dVar26 = local_78._0_8_ * dStack_90;
      local_98 = (dVar26 + dVar26) / (dStack_90 + local_78._0_8_);
      local_88 = dStack_90;
      dStack_80 = dStack_90;
      *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107954;
      info("    %-6s",pcVar18);
      *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107962;
      info("  Pr=%.2f");
      *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107970;
      info("  Rc=%.2f");
      dVar26 = local_98;
      *(undefined8 *)((long)&uStack_100 + lVar10) = 0x107982;
      info("  F1=%.2f\n",dVar26);
    }
    *(undefined8 *)((long)&uStack_100 + lVar10) = 1;
    iVar12 = (int)*(undefined8 *)((long)&uStack_100 + lVar10);
  }
  return iVar12;
}

Assistant:

int tag_label(mdl_t *mdl, FILE *fin, FILE *fout) {
	qrk_t *lbls = mdl->reader->lbl;
	const uint32_t Y = mdl->nlbl;
	const uint32_t N = mdl->opt->nbest;
	// We start by preparing the statistic collection to be ready if check
	// option is used. The stat array hold the following for each label
	//   [0] # of reference with this label
	//   [1] # of token we have taged with this label
	//   [2] # of match of the two preceding
	uint64_t tcnt = 0, terr = 0;
	uint64_t scnt = 0, serr = 0;
	uint64_t stat[3][Y];
	for (uint32_t y = 0; y < Y; y++)
		stat[0][y] = stat[1][y] = stat[2][y] = 0;
	// Next read the input file sequence by sequence and label them, we have
	// to take care of not discarding the raw input as we want to send it
	// back to the output with the additional predicted labels.
	while (!feof(fin)) {
		// So, first read an input sequence keeping the raw_t object
		// available, and label it with Viterbi.
		raw_t *raw = rdr_readraw(mdl->reader, fin);
		if (raw == NULL)
			break;
		seq_t *seq = rdr_raw2seq(mdl->reader, raw,
			mdl->opt->check | mdl->opt->force);
        if (seq == NULL) {
            rdr_freeraw(raw);
            return 0;
        }
		const uint32_t T = seq->len;
		uint32_t *out = xmalloc(sizeof(uint32_t) * T * N);
		double   *psc = xmalloc(sizeof(double  ) * T * N);
		double   *scs = xmalloc(sizeof(double  ) * N);
		if (N == 1)
			tag_viterbi(mdl, seq, (uint32_t*)out, scs, (double*)psc);
		else
			tag_nbviterbi(mdl, seq, N, (void*)out, scs, (void*)psc);
		// Next we output the raw sequence with an aditional column for
		// the predicted labels
		for (uint32_t n = 0; n < N; n++) {
			if (mdl->opt->outsc)
				fprintf(fout, "# %d %f\n", (int)n, scs[n]);
			for (uint32_t t = 0; t < T; t++) {
				if (!mdl->opt->label)
					fprintf(fout, "%s\t", raw->lines[t]);
				uint32_t lbl = out[t * N + n];
				const char *lblstr = qrk_id2str(lbls, lbl);
				fprintf(fout, "%s", lblstr);
				if (mdl->opt->outsc) {
					fprintf(fout, "\t%s", lblstr);
					fprintf(fout, "/%f", psc[t * N + n]);
				}
				fprintf(fout, "\n");
			}
			fprintf(fout, "\n");
		}
		fflush(fout);
		// If user provided reference labels, use them to collect
		// statistics about how well we have performed here. Labels
		// unseen at training time are discarded.
		if (mdl->opt->check) {
			bool err = false;
			for (uint32_t t = 0; t < T; t++) {
				if (seq->pos[t].lbl == (uint32_t)-1)
					continue;
				stat[0][seq->pos[t].lbl]++;
				stat[1][out[t * N]]++;
				if (seq->pos[t].lbl != out[t * N])
					terr++, err = true;
				else
					stat[2][out[t * N]]++;
			}
			tcnt += T;
			serr += err;
		}
		// Cleanup memory used for this sequence
		free(scs);
		free(psc);
		free(out);
		rdr_freeseq(seq);
		rdr_freeraw(raw);
		// And report our progress, at regular interval we display how
		// much sequence are labelled and if possible the current tokens
		// and sequence error rates.
		if (++scnt % 1000 == 0) {
			info("%10"PRIu64" sequences labeled", scnt);
			if (mdl->opt->check) {
				const double te = (double)terr  / tcnt * 100.0;
				const double se = (double)serr  / scnt * 100.0;
				info("\t%5.2f%%/%5.2f%%", te, se);
			}
			info("\n");
		}
	}
	// If user have provided reference labels, we have collected a lot of
	// statistics and we can repport global token and sequence error rate as
	// well as precision recall and f-measure for each labels.
	if (mdl->opt->check) {
		const double te = (double)terr  / tcnt * 100.0;
		const double se = (double)serr  / scnt * 100.0;
		info("    Nb sequences  : %"PRIu64"\n", scnt);
		info("    Token error   : %5.2f%%\n", te);
		info("    Sequence error: %5.2f%%\n", se);
		info("* Per label statistics\n");
		for (uint32_t y = 0; y < Y; y++) {
			const char   *lbl = qrk_id2str(lbls, y);
			const double  Rc  = (double)stat[2][y] / stat[0][y];
			const double  Pr  = (double)stat[2][y] / stat[1][y];
			const double  F1  = 2.0 * (Pr * Rc) / (Pr + Rc);
			info("    %-6s", lbl);
			info("  Pr=%.2f", Pr);
			info("  Rc=%.2f", Rc);
			info("  F1=%.2f\n", F1);
		}
	}
    
    return 1;
}